

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_swap.c
# Opt level: O2

REF_STATUS ref_swap_same_faceid(REF_GRID ref_grid,REF_INT node0,REF_INT node1,REF_BOOL *allowed)

{
  uint uVar1;
  REF_CELL ref_cell;
  REF_ADJ pRVar2;
  REF_ADJ_ITEM pRVar3;
  uint uVar4;
  int iVar5;
  undefined8 uVar6;
  ulong uVar7;
  int iVar8;
  char *pcVar9;
  int iVar10;
  uint uVar11;
  REF_BOOL has_qua;
  REF_BOOL has_tri;
  REF_BOOL has_edg;
  REF_INT ncell;
  REF_INT cell_to_swap [2];
  REF_INT nodes [27];
  
  ref_cell = ref_grid->cell[3];
  *allowed = 0;
  uVar4 = ref_cell_has_side(ref_grid->cell[0],node0,node1,&has_edg);
  if (uVar4 == 0) {
    uVar4 = ref_cell_has_side(ref_grid->cell[3],node0,node1,&has_tri);
    if (uVar4 == 0) {
      uVar4 = ref_cell_has_side(ref_grid->cell[6],node0,node1,&has_qua);
      if (uVar4 == 0) {
        if ((has_edg == 0) && ((has_tri == 0 || (has_qua == 0)))) {
          uVar4 = ref_cell_list_with2(ref_cell,node0,node1,2,&ncell,cell_to_swap);
          if (uVar4 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",
                   0x163,"ref_swap_same_faceid",(ulong)uVar4,"more then two");
            ref_node_location(ref_grid->node,node0);
            ref_node_location(ref_grid->node,node1);
            uVar7 = 0xffffffff;
            uVar11 = 0xffffffff;
            if (-1 < node0) {
              pRVar2 = ref_cell->ref_adj;
              uVar7 = 0xffffffff;
              uVar11 = 0xffffffff;
              if (node0 < pRVar2->nnode) {
                uVar1 = pRVar2->first[(uint)node0];
                uVar7 = 0xffffffff;
                uVar11 = 0xffffffff;
                if ((long)(int)uVar1 != -1) {
                  uVar11 = pRVar2->item[(int)uVar1].ref;
                  uVar7 = (ulong)uVar1;
                }
              }
            }
            while ((int)uVar7 != -1) {
              for (iVar10 = 0; iVar10 < ref_cell->node_per; iVar10 = iVar10 + 1) {
                iVar5 = ref_cell->size_per * uVar11;
                if (ref_cell->c2n[iVar5 + iVar10] == node1) {
                  iVar8 = 0;
                  printf("cell %d cell id %d\n",(ulong)uVar11,
                         (ulong)(uint)ref_cell->c2n[iVar5 + ref_cell->node_per]);
                  while( true ) {
                    iVar5 = ref_cell->size_per * uVar11;
                    if (ref_cell->node_per <= iVar8) break;
                    printf(" %d",(ulong)(uint)ref_cell->c2n[iVar5 + iVar8]);
                    iVar8 = iVar8 + 1;
                  }
                  printf(" %d\n",(ulong)(uint)ref_cell->c2n[iVar5 + ref_cell->node_per]);
                }
              }
              pRVar3 = ref_cell->ref_adj->item;
              uVar7 = (ulong)pRVar3[(int)uVar7].next;
              uVar11 = 0xffffffff;
              if (uVar7 != 0xffffffffffffffff) {
                uVar11 = pRVar3[uVar7].ref;
              }
            }
            ref_export_by_extension(ref_grid,"ref_swap_same_faceid.tec");
            return uVar4;
          }
          if ((long)ncell == 2) {
            uVar4 = ref_cell_nodes(ref_cell,cell_to_swap[0],nodes);
            if (uVar4 == 0) {
              iVar10 = nodes[ref_cell->node_per];
              uVar4 = ref_cell_nodes(ref_cell,cell_to_swap[1],nodes);
              if (uVar4 == 0) {
                if (iVar10 != nodes[ref_cell->node_per]) {
                  return 0;
                }
                *allowed = 1;
                return 0;
              }
              uVar7 = (ulong)uVar4;
              pcVar9 = "nodes tri1";
              uVar6 = 0x171;
            }
            else {
              uVar7 = (ulong)uVar4;
              pcVar9 = "nodes tri0";
              uVar6 = 0x16f;
            }
            goto LAB_001f072d;
          }
          if (ncell != 0) {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",
                   0x16d,"ref_swap_same_faceid","there should be zero or two triangles for manifold"
                   ,2,(long)ncell);
            ref_node_location(ref_grid->node,node0);
            ref_node_location(ref_grid->node,node1);
            ref_export_by_extension(ref_grid,"ref_swap_same_faceid.tec");
            return 1;
          }
          *allowed = 1;
        }
        else {
          *allowed = 0;
        }
        return 0;
      }
      uVar7 = (ulong)uVar4;
      pcVar9 = "qua side";
      uVar6 = 0x158;
    }
    else {
      uVar7 = (ulong)uVar4;
      pcVar9 = "tri side";
      uVar6 = 0x156;
    }
  }
  else {
    uVar7 = (ulong)uVar4;
    pcVar9 = "edg side";
    uVar6 = 0x154;
  }
LAB_001f072d:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",uVar6,
         "ref_swap_same_faceid",uVar7,pcVar9);
  return (REF_STATUS)uVar7;
}

Assistant:

REF_FCN REF_STATUS ref_swap_same_faceid(REF_GRID ref_grid, REF_INT node0,
                                        REF_INT node1, REF_BOOL *allowed) {
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_INT ncell;
  REF_INT cell_to_swap[2];
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT id0, id1;
  REF_BOOL has_edg, has_tri, has_qua;

  *allowed = REF_FALSE;

  RSS(ref_cell_has_side(ref_grid_edg(ref_grid), node0, node1, &has_edg),
      "edg side");
  RSS(ref_cell_has_side(ref_grid_tri(ref_grid), node0, node1, &has_tri),
      "tri side");
  RSS(ref_cell_has_side(ref_grid_qua(ref_grid), node0, node1, &has_qua),
      "qua side");
  if (has_edg || (has_tri && has_qua)) {
    *allowed = REF_FALSE;
    return REF_SUCCESS;
  }
  RSB(ref_cell_list_with2(ref_cell, node0, node1, 2, &ncell, cell_to_swap),
      "more then two", {
        ref_node_location(ref_grid_node(ref_grid), node0);
        ref_node_location(ref_grid_node(ref_grid), node1);
        ref_swap_tattle_nodes(ref_cell, node0, node1);
        ref_export_by_extension(ref_grid, "ref_swap_same_faceid.tec");
      });

  if (0 == ncell) { /* away from boundary */
    *allowed = REF_TRUE;
    return REF_SUCCESS;
  }
  REIB(2, ncell, "there should be zero or two triangles for manifold", {
    ref_node_location(ref_grid_node(ref_grid), node0);
    ref_node_location(ref_grid_node(ref_grid), node1);
    ref_export_by_extension(ref_grid, "ref_swap_same_faceid.tec");
  });

  RSS(ref_cell_nodes(ref_cell, cell_to_swap[0], nodes), "nodes tri0");
  id0 = nodes[ref_cell_node_per(ref_cell)];
  RSS(ref_cell_nodes(ref_cell, cell_to_swap[1], nodes), "nodes tri1");
  id1 = nodes[ref_cell_node_per(ref_cell)];

  if (id0 == id1) {
    *allowed = REF_TRUE;
    return REF_SUCCESS;
  }

  return REF_SUCCESS;
}